

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

__pid_t __thiscall kj::Executor::wait(Executor *this,void *__stat_loc)

{
  Mutex *this_00;
  XThreadEvent **ppXVar1;
  RemoveConst<kj::_::XThreadEvent_*> *ppXVar2;
  XThreadEvent **ppXVar3;
  __pid_t extraout_EAX;
  __pid_t _Var4;
  Vector<kj::_::XThreadEvent_*> eventsToCancelOutsideLock;
  Locked<kj::Executor::Impl::State> lock;
  PredicateImpl_conflict impl;
  undefined1 local_69;
  Vector<kj::_::XThreadEvent_*> local_68;
  Mutex *local_48;
  State *local_40;
  undefined **local_38;
  undefined1 *local_30;
  State *local_28;
  undefined1 local_20;
  
  local_68.builder.ptr = (XThreadEvent **)0x0;
  local_68.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
  local_68.builder.endPtr = (XThreadEvent **)0x0;
  local_68.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  this_00 = (Mutex *)(this->impl).ptr;
  local_38 = (undefined **)((ulong)local_38 & 0xffffffffffffff00);
  kj::_::Mutex::lock(this_00,0);
  local_40 = (State *)(this_00 + 1);
  local_38 = &PTR_check_0038b918;
  local_30 = &local_69;
  local_20 = 0;
  local_48 = this_00;
  local_28 = local_40;
  kj::_::Mutex::wait(this_00,&local_38);
  Impl::State::dispatchAll(local_40,&local_68);
  if (local_48 != (Mutex *)0x0) {
    kj::_::Mutex::unlock(local_48,EXCLUSIVE,(Waiter *)0x0);
  }
  Impl::processAsyncCancellations((this->impl).ptr,&local_68);
  ppXVar3 = local_68.builder.endPtr;
  ppXVar2 = local_68.builder.pos;
  ppXVar1 = local_68.builder.ptr;
  _Var4 = extraout_EAX;
  if (local_68.builder.ptr != (XThreadEvent **)0x0) {
    local_68.builder.ptr = (XThreadEvent **)0x0;
    local_68.builder.pos = (RemoveConst<kj::_::XThreadEvent_*> *)0x0;
    local_68.builder.endPtr = (XThreadEvent **)0x0;
    _Var4 = (*(code *)**(undefined8 **)local_68.builder.disposer)
                      (local_68.builder.disposer,ppXVar1,8,(long)ppXVar2 - (long)ppXVar1 >> 3,
                       (long)ppXVar3 - (long)ppXVar1 >> 3,0);
  }
  return _Var4;
}

Assistant:

void Executor::wait() {
  Vector<_::XThreadEvent*> eventsToCancelOutsideLock;
  KJ_DEFER(impl->processAsyncCancellations(eventsToCancelOutsideLock));

  auto lock = impl->state.lockExclusive();

  lock.wait([](const Impl::State& state) {
    return state.isDispatchNeeded();
  });

  lock->dispatchAll(eventsToCancelOutsideLock);
}